

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

size_t embree::avx::createMortonCodeArray<embree::QuadMesh>
                 (QuadMesh *mesh,mvector<BVHBuilderMorton::BuildPrim> *morton,
                 BuildProgressMonitor *progressMonitor)

{
  intrusive_list_node *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  intrusive_list_node *piVar8;
  char cVar9;
  int iVar10;
  runtime_error *prVar11;
  ulong uVar12;
  unsigned_long uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t taskCount;
  MortonCodeMapping mapping_1;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
  body;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb_empty;
  task_group_context context;
  auto_partitioner local_591;
  unsigned_long local_590;
  unsigned_long local_588;
  undefined1 local_580 [8];
  intrusive_list_node *local_578;
  anon_class_8_1_898bcfc2_conflict11 local_570;
  anon_class_24_3_aac2c921 local_568;
  anon_class_40_5_11684cf9_conflict2 local_550;
  undefined1 local_528 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_518;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [12];
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined1 local_4d8 [16];
  intrusive_list_node *local_4c8;
  intrusive_list_node *piStack_4c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aaStack_4a8 [4];
  intrusive_list_node *local_468 [2];
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined1 local_430 [64];
  string_resource_index local_3f0;
  long alStack_230 [64];
  
  local_518._8_8_ = local_518._0_8_;
  local_4d8._8_8_ = local_4d8._0_8_;
  local_568.mapping = (MortonCodeMapping *)local_580;
  piVar1 = (intrusive_list_node *)morton->size_active;
  local_468[0] = (intrusive_list_node *)0x0;
  local_458 = 0x7f800000;
  uStack_454 = 0x7f800000;
  uStack_450 = 0x7f800000;
  uStack_44c = 0x7f800000;
  uStack_448 = 0xff800000;
  uStack_444 = 0xff800000;
  uStack_440 = 0xff800000;
  uStack_43c = 0xff800000;
  local_430[0xc] = proxy_support;
  local_430[0xd] = (context_traits)0x4;
  local_430._32_16_ = ZEXT816(0);
  local_3f0 = CUSTOM_CTX;
  local_580 = (undefined1  [8])mesh;
  tbb::detail::r1::initialize((task_group_context *)local_430);
  local_550.last = (unsigned_long *)0x0;
  local_550.taskCount = (size_t *)0x400;
  local_528._0_8_ = &local_590;
  stack0xfffffffffffffb20 = (MortonCodeMapping *)local_528;
  local_4e8._0_8_ = local_468;
  local_4d8._0_8_ = local_528._0_8_;
  local_4c8 = local_468[0];
  local_4b8._0_8_ = CONCAT44(uStack_454,local_458);
  local_4b8._8_8_ = CONCAT44(uStack_44c,uStack_450);
  aaStack_4a8[0]._0_8_ = CONCAT44(uStack_444,uStack_448);
  aaStack_4a8[0]._8_8_ = CONCAT44(uStack_43c,uStack_440);
  local_550.first = (unsigned_long *)piVar1;
  local_528._8_8_ = &local_568;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_reduce.h:59:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/primrefgen.cpp:177:14)>,_const_tbb::detail::d1::auto_partitioner>
  ::run((blocked_range<unsigned_long> *)&local_550,
        (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
         *)local_4e8,(auto_partitioner *)&local_570,(task_group_context *)local_430);
  piVar8 = local_4c8;
  local_4f8 = local_4b8._0_8_;
  uStack_4f0 = local_4b8._8_8_;
  local_508 = aaStack_4a8[0]._0_8_;
  uStack_500 = aaStack_4a8[0]._8_8_;
  cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_430);
  if (cVar9 != '\0') {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"task cancelled");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)local_430);
  aVar7._8_8_ = uStack_4f0;
  aVar7._0_8_ = local_4f8;
  auVar6._8_8_ = uStack_500;
  auVar6._0_8_ = local_508;
  auVar6 = vsubps_avx(auVar6,(undefined1  [16])aVar7);
  if (piVar8 == piVar1) {
    auVar19._8_4_ = 0x1fec1e4a;
    auVar19._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar19._12_4_ = 0x1fec1e4a;
    auVar20 = vcmpps_avx(auVar6,auVar19,6);
    auVar18 = vrcpps_avx(auVar6);
    fVar2 = auVar18._0_4_;
    auVar15._0_4_ = auVar6._0_4_ * fVar2;
    fVar3 = auVar18._4_4_;
    auVar15._4_4_ = auVar6._4_4_ * fVar3;
    fVar4 = auVar18._8_4_;
    auVar15._8_4_ = auVar6._8_4_ * fVar4;
    fVar5 = auVar18._12_4_;
    auVar15._12_4_ = auVar6._12_4_ * fVar5;
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = &DAT_3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar6 = vsubps_avx(auVar21,auVar15);
    auVar16._0_4_ = (fVar2 + fVar2 * auVar6._0_4_) * 1013.76;
    auVar16._4_4_ = (fVar3 + fVar3 * auVar6._4_4_) * 1013.76;
    auVar16._8_4_ = (fVar4 + fVar4 * auVar6._8_4_) * 1013.76;
    auVar16._12_4_ = (fVar5 + fVar5 * auVar6._12_4_) * 1013.76;
    local_4d8 = vandps_avx(auVar20,auVar16);
    local_528._8_8_ = morton;
    local_528._0_8_ =
         (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
          *)local_4e8;
    local_518._0_8_ = local_580;
    local_430[0xc] = proxy_support;
    local_430[0xd] = (context_traits)0x4;
    local_430._32_16_ = ZEXT816(0) << 0x20;
    local_3f0 = CUSTOM_CTX;
    _local_4e8 = aVar7;
    tbb::detail::r1::initialize((task_group_context *)local_430);
    local_550.last = (unsigned_long *)0x0;
    local_550.taskCount = (size_t *)0x400;
    local_568.mapping = (MortonCodeMapping *)local_528;
    local_550.first = (unsigned_long *)piVar1;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&local_550,(anon_class_8_1_898bcfc2 *)&local_568,
          (auto_partitioner *)&local_570,(task_group_context *)local_430);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_430);
    if (cVar9 != '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_430);
  }
  else {
    auVar20._8_4_ = 0x1fec1e4a;
    auVar20._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar20._12_4_ = 0x1fec1e4a;
    auVar20 = vcmpps_avx(auVar6,auVar20,6);
    auVar18 = vrcpps_avx(auVar6);
    fVar2 = auVar18._0_4_;
    auVar17._0_4_ = auVar6._0_4_ * fVar2;
    fVar3 = auVar18._4_4_;
    auVar17._4_4_ = auVar6._4_4_ * fVar3;
    fVar4 = auVar18._8_4_;
    auVar17._8_4_ = auVar6._8_4_ * fVar4;
    fVar5 = auVar18._12_4_;
    auVar17._12_4_ = auVar6._12_4_ * fVar5;
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = &DAT_3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    auVar6 = vsubps_avx(auVar22,auVar17);
    auVar18._0_4_ = (fVar2 + fVar2 * auVar6._0_4_) * 1013.76;
    auVar18._4_4_ = (fVar3 + fVar3 * auVar6._4_4_) * 1013.76;
    auVar18._8_4_ = (fVar4 + fVar4 * auVar6._8_4_) * 1013.76;
    auVar18._12_4_ = (fVar5 + fVar5 * auVar6._12_4_) * 1013.76;
    local_518 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandps_avx(auVar20,auVar18);
    local_568.mesh = (TriangleMesh **)local_580;
    local_590 = 0;
    local_578 = piVar1;
    local_568.mapping = (MortonCodeMapping *)local_528;
    local_568.morton = morton;
    local_528 = (undefined1  [16])aVar7;
    iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar12 = (long)local_578 + (0x3ff - local_590) >> 10;
    if ((ulong)(long)iVar10 < uVar12) {
      uVar12 = (long)iVar10;
    }
    uVar13 = 0x40;
    if (uVar12 < 0x40) {
      uVar13 = uVar12;
    }
    local_550.taskCount = &local_588;
    local_550.first = &local_590;
    local_550.state = (ParallelPrefixSumState<unsigned_long> *)local_430;
    local_550.func = &local_568;
    uStack_4dc = 0x401;
    local_4c8 = (intrusive_list_node *)0x0;
    piStack_4c0 = (intrusive_list_node *)0x0;
    aaStack_4a8[0]._0_8_ = 8;
    local_588 = uVar13;
    local_550.last = (unsigned_long *)(local_580 + 8);
    tbb::detail::r1::initialize((task_group_context *)local_4e8);
    local_570.func = &local_550;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar13,1,&local_570,&local_591,(task_group_context *)local_4e8);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_4e8);
    if (cVar9 != '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_4e8);
    if (local_588 != 0) {
      uVar13 = 0;
      lVar14 = 0;
      do {
        alStack_230[uVar13] = lVar14;
        lVar14 = lVar14 + *(long *)(local_430 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (local_588 != uVar13);
    }
    local_568.mesh = (TriangleMesh **)local_580;
    local_590 = 0;
    local_578 = piVar1;
    local_568.mapping = (MortonCodeMapping *)local_528;
    local_568.morton = morton;
    iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar12 = (long)local_578 + (0x3ff - local_590) >> 10;
    if ((ulong)(long)iVar10 < uVar12) {
      uVar12 = (long)iVar10;
    }
    uVar13 = 0x40;
    if (uVar12 < 0x40) {
      uVar13 = uVar12;
    }
    local_550.first = &local_590;
    local_550.last = (unsigned_long *)(local_580 + 8);
    local_550.taskCount = &local_588;
    local_550.state = (ParallelPrefixSumState<unsigned_long> *)local_430;
    local_550.func = &local_568;
    uStack_4dc = 0x401;
    local_4c8 = (intrusive_list_node *)0x0;
    piStack_4c0 = (intrusive_list_node *)0x0;
    aaStack_4a8[0]._0_8_ = 8;
    local_588 = uVar13;
    tbb::detail::r1::initialize((task_group_context *)local_4e8);
    local_570.func = &local_550;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar13,1,&local_570,&local_591,(task_group_context *)local_4e8);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_4e8);
    if (cVar9 != '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_4e8);
    if (local_588 != 0) {
      uVar13 = 0;
      lVar14 = 0;
      do {
        alStack_230[uVar13] = lVar14;
        lVar14 = lVar14 + *(long *)(local_430 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (local_588 != uVar13);
    }
  }
  return (size_t)piVar8;
}

Assistant:

size_t createMortonCodeArray(Mesh* mesh, mvector<BVHBuilderMorton::BuildPrim>& morton, BuildProgressMonitor& progressMonitor)
    {
      size_t numPrimitives = morton.size();

      /* compute scene bounds */
      std::pair<size_t,BBox3fa> cb_empty(0,empty);
      auto cb = parallel_reduce 
        ( size_t(0), numPrimitives, size_t(1024), cb_empty, [&](const range<size_t>& r) -> std::pair<size_t,BBox3fa>
          {
            size_t num = 0;
            BBox3fa bounds = empty;
            
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa prim_bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&prim_bounds))) continue;
              bounds.extend(center2(prim_bounds));
              num++;
            }
            return std::make_pair(num,bounds);
          }, [] (const std::pair<size_t,BBox3fa>& a, const std::pair<size_t,BBox3fa>& b) {
          return std::make_pair(a.first + b.first,merge(a.second,b.second)); 
        });
      
      
      size_t numPrimitivesGen = cb.first;
      const BBox3fa centBounds = cb.second;
      
      /* compute morton codes */
      if (likely(numPrimitivesGen == numPrimitives))
      {
        /* fast path if all primitives were valid */
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_for( size_t(0), numPrimitives, size_t(1024), [&](const range<size_t>& r) -> void {
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
              generator(mesh->bounds(j),unsigned(j));
          });
      }
      else
      {
        /* slow path, fallback in case some primitives were invalid */
        ParallelPrefixSumState<size_t> pstate;
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&bounds))) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());
        
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[base]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (!mesh->buildBounds(j,&bounds)) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());          
      }
      return numPrimitivesGen;
    }